

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall
NEST::LArNEST::LegacyGetRecombinationProbability
          (LArNEST *this,double energy,double efield,double density,int pdgcode,double track_length)

{
  int iVar1;
  double dVar2;
  double DokeBirksB;
  double DokeBirksC;
  double DokeBirksA;
  double ratio;
  double recombProb;
  double LET;
  double dx;
  double dE;
  double track_length_local;
  int pdgcode_local;
  double density_local;
  double efield_local;
  double energy_local;
  LArNEST *this_local;
  
  recombProb = 0.0;
  iVar1 = pdgcode;
  if (pdgcode < 1) {
    iVar1 = -pdgcode;
  }
  if (iVar1 != 0xb) {
    iVar1 = pdgcode;
    if (pdgcode < 1) {
      iVar1 = -pdgcode;
    }
    if (iVar1 != 0xd) {
      recombProb = LegacyGetLinearEnergyTransfer(this,energy);
      goto LAB_001261de;
    }
  }
  dVar2 = track_length / 10.0;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    recombProb = ((energy / 1000.0) / dVar2) * (1.0 / density);
  }
  if (((0.0 < recombProb) && (0.0 < energy)) && (0.0 < dVar2)) {
    dVar2 = LegacyGetLinearEnergyTransfer(this,energy);
    if ((dVar2 / recombProb < 0.7) && (pdgcode == 0xb)) {
      recombProb = (dVar2 / recombProb) * recombProb;
    }
  }
LAB_001261de:
  dVar2 = pow(efield / 1000.0,-0.85);
  DokeBirksC = dVar2 * 0.07;
  DokeBirksB = 0.0;
  if ((efield == 0.0) && (!NAN(efield))) {
    DokeBirksC = 0.0003;
    DokeBirksB = 0.75;
  }
  ratio = ((DokeBirksC * recombProb) / ((DokeBirksC / (1.0 - DokeBirksB)) * recombProb + 1.0) +
          DokeBirksB) * (density / 1.393);
  if (ratio < 0.0) {
    ratio = 0.0;
  }
  if (1.0 < ratio) {
    ratio = 1.0;
  }
  return ratio;
}

Assistant:

double LArNEST::LegacyGetRecombinationProbability(double energy, double efield,
                                                  double density, int pdgcode,
                                                  double track_length) {
  // this section calculates recombination following the modified
  // Birks' Law of Doke, deposition by deposition, may be overridden
  // later in code if a low enough energy necessitates switching to the
  // Thomas-Imel box model for recombination instead (determined by site)
  double dE = energy;
  double dx = 0.0;
  double LET = 0.0;
  double recombProb;
  if (abs(pdgcode) != 11 && abs(pdgcode) != 13) {
    // e-: 11, e+: -11, mu-: 13, mu+: -13
    // in other words, if it's a gamma,ion,proton,alpha,pion,et al. do not
    // use the step length provided by Geant4 because it's not relevant,
    // instead calculate an estimated LET and range of the electrons that
    // would have been produced if Geant4 could track them
    LET = LegacyGetLinearEnergyTransfer(dE);
    if (LET) {
      // find the range based on the LET
      dx = (dE / 1e3) / (density * LET);
    }
    if (abs(pdgcode) == 2112)  // nuclear recoils
    {
      dx = 0;
    }
  } else  // normal case of an e-/+ energy deposition recorded by Geant
  {
    dx = track_length / 10.;
    if (dx) {
      LET = ((dE / 1e3) / dx) *
            (1 / density);  // lin. energy xfer (prop. to dE/dx)
    }
    if (LET > 0 && dE > 0 && dx > 0) {
      double ratio = LegacyGetLinearEnergyTransfer(dE) / LET;
      if (ratio < 0.7 && pdgcode == 11) {
        dx /= ratio;
        LET *= ratio;
      }
    }
  }
  // set up DokeBirks coefficients
  double DokeBirksA = 0.07 * pow((efield / 1.0e3), -0.85);
  double DokeBirksC = 0.00;
  if (efield == 0.0) {
    DokeBirksA = 0.0003;
    DokeBirksC = 0.75;
  }
  // B=A/(1-C) (see paper)
  double DokeBirksB = DokeBirksA / (1 - DokeBirksC);
  recombProb = ((DokeBirksA * LET) / (1 + DokeBirksB * LET) + DokeBirksC) *
               (density / legacy_density_LAr);

  // check against unphysicality resulting from rounding errors
  if (recombProb < 0.0) {
    recombProb = 0.0;
  }
  if (recombProb > 1.0) {
    recombProb = 1.0;
  }
  return recombProb;
}